

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

Image * __thiscall
pbrt::Image::ConvertToFormat
          (Image *__return_storage_ptr__,Image *this,PixelFormat newFormat,
          ColorEncodingHandle *encoding)

{
  Tuple2<pbrt::Point2,_int> resolution;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_t sVar2;
  Allocator alloc;
  int c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  Point2i p;
  ulong uVar4;
  Float value;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  long local_48;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_38;
  
  if (this->format == newFormat) {
    Image(__return_storage_ptr__,this);
  }
  else {
    resolution = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
    pbVar1 = (this->channelNames).ptr;
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->channelNames).field_2;
    if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar3 = pbVar1;
    }
    sVar2 = (this->channelNames).nStored;
    local_38.bits =
         (encoding->
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         ).bits;
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    channels.n = sVar2;
    channels.ptr = pbVar3;
    Image(__return_storage_ptr__,newFormat,(Point2i)resolution,channels,
          (ColorEncodingHandle *)&local_38,alloc);
    if (0 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.y) {
      local_48 = 0;
      do {
        if (0 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.x) {
          uVar4 = 0;
          do {
            if (0 < (int)(this->channelNames).nStored) {
              p.super_Tuple2<pbrt::Point2,_int> =
                   (Tuple2<pbrt::Point2,_int>)(local_48 << 0x20 | uVar4);
              c = 0;
              do {
                value = GetChannel(this,p,c,(WrapMode2D)0x200000002);
                SetChannel(__return_storage_ptr__,p,c,value);
                c = c + 1;
              } while (c < (int)(this->channelNames).nStored);
            }
            uVar4 = uVar4 + 1;
          } while ((long)uVar4 < (long)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x);
        }
        local_48 = local_48 + 1;
      } while (local_48 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.y);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image Image::ConvertToFormat(PixelFormat newFormat, ColorEncodingHandle encoding) const {
    if (newFormat == format)
        return *this;

    Image newImage(newFormat, resolution, channelNames, encoding);
    for (int y = 0; y < resolution.y; ++y)
        for (int x = 0; x < resolution.x; ++x)
            for (int c = 0; c < NChannels(); ++c)
                newImage.SetChannel({x, y}, c, GetChannel({x, y}, c));
    return newImage;
}